

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

AActor * __thiscall FActorIterator::Next(FActorIterator *this)

{
  bool bVar1;
  FActorIterator *this_local;
  
  if (this->id == 0) {
    this_local = (FActorIterator *)0x0;
  }
  else {
    if (this->base == (AActor *)0x0) {
      this->base = AActor::TIDHash[(int)(this->id & 0x7f)];
    }
    else {
      this->base = this->base->inext;
    }
    while( true ) {
      bVar1 = false;
      if (this->base != (AActor *)0x0) {
        bVar1 = this->base->tid != this->id;
      }
      if (!bVar1) break;
      this->base = this->base->inext;
    }
    this_local = (FActorIterator *)this->base;
  }
  return (AActor *)this_local;
}

Assistant:

AActor *Next ()
	{
		if (id == 0)
			return NULL;
		if (!base)
			base = AActor::TIDHash[id & 127];
		else
			base = base->inext;

		while (base && base->tid != id)
			base = base->inext;

		return base;
	}